

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBodyAuxRef.cpp
# Opt level: O1

void __thiscall chrono::ChBodyAuxRef::ArchiveOUT(ChBodyAuxRef *this)

{
  ChArchiveOut *in_RSI;
  
  ArchiveOUT((ChBodyAuxRef *)
             ((long)&this[-1].auxref_to_abs.super_ChFrame<double>.Amatrix.
                     super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data +
             0x40),in_RSI);
  return;
}

Assistant:

void ChBodyAuxRef::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChBodyAuxRef>();

    // serialize parent class
    ChBody::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(auxref_to_cog);
    marchive << CHNVP(auxref_to_abs);
}